

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3_blob_open(sqlite3 *db,char *zDb,char *zTable,char *zColumn,sqlite_int64 iRow,int wrFlag,
                     sqlite3_blob **ppBlob)

{
  byte bVar1;
  byte bVar2;
  u8 uVar3;
  Schema *pSVar4;
  Schema *pSVar5;
  uint p2;
  char *p;
  Incrblob *p_00;
  Table *pTVar6;
  Index *pIVar7;
  Vdbe *p_01;
  VdbeOp *pVVar8;
  long lVar9;
  Schema **ppSVar10;
  Op *pOVar11;
  int iVar12;
  FKey *pFVar13;
  uint uVar14;
  Vdbe *v;
  char *pcVar15;
  uint uVar16;
  ulong uVar17;
  long in_FS_OFFSET;
  char *zErr;
  Parse sParse;
  int local_230;
  uint local_214;
  char *local_1e8;
  Parse local_1e0;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_1e8 = (char *)0x0;
  memset(&local_1e0,0xaa,0x1a8);
  *ppBlob = (sqlite3_blob *)0x0;
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  p2 = (uint)(wrFlag != 0);
  p_00 = (Incrblob *)sqlite3DbMallocZero(db,0x38);
  local_214 = 0;
  local_230 = 0;
LAB_00127695:
  memset(&local_1e0.zErrMsg,0,0xe0);
  memset(&local_1e0.sLastToken,0,0x88);
  local_1e0.pOuterParse = db->pParse;
  db->pParse = &local_1e0;
  local_1e0.db = db;
  if (db->mallocFailed != '\0') {
    sqlite3ErrorMsg(&local_1e0,"out of memory");
  }
  if (p_00 != (Incrblob *)0x0) {
    if (local_1e8 != (char *)0x0) {
      sqlite3DbFreeNN(db,local_1e8);
    }
    local_1e8 = (char *)0x0;
    if (db->noSharedCache == '\0') {
      btreeEnterAll(db);
    }
    pTVar6 = sqlite3LocateTable(&local_1e0,0,zTable,zDb);
    if (pTVar6 == (Table *)0x0) {
      pTVar6 = (Table *)0x0;
    }
    else if (pTVar6->eTabType == '\x01') {
      sqlite3ErrorMsg(&local_1e0,"cannot open virtual table: %s",zTable);
      pTVar6 = (Table *)0x0;
    }
    if (pTVar6 == (Table *)0x0) {
LAB_001277b0:
      pTVar6 = (Table *)0x0;
    }
    else if ((pTVar6->tabFlags & 0x80) != 0) {
      sqlite3ErrorMsg(&local_1e0,"cannot open table without rowid: %s",zTable);
      goto LAB_001277b0;
    }
    if (pTVar6 == (Table *)0x0) {
LAB_001277dc:
      pTVar6 = (Table *)0x0;
    }
    else if ((pTVar6->tabFlags & 0x60) != 0) {
      sqlite3ErrorMsg(&local_1e0,"cannot open table with generated columns: %s",zTable);
      goto LAB_001277dc;
    }
    if (pTVar6 == (Table *)0x0) {
LAB_00127808:
      pTVar6 = (Table *)0x0;
    }
    else if (pTVar6->eTabType == '\x02') {
      sqlite3ErrorMsg(&local_1e0,"cannot open view: %s",zTable);
      goto LAB_00127808;
    }
    if (pTVar6 != (Table *)0x0) {
      p_00->pTab = pTVar6;
      if (pTVar6->pSchema == (Schema *)0x0) {
        lVar9 = -0x8000;
      }
      else {
        lVar9 = -0x100000000;
        ppSVar10 = &db->aDb->pSchema;
        do {
          lVar9 = lVar9 + 0x100000000;
          pSVar4 = *ppSVar10;
          ppSVar10 = ppSVar10 + 4;
        } while (pSVar4 != pTVar6->pSchema);
        lVar9 = lVar9 >> 0x20;
      }
      p_00->zDb = db->aDb[lVar9].zDbSName;
      uVar14 = (uint)pTVar6->nCol;
      if (0 < pTVar6->nCol) {
        uVar17 = 0;
LAB_00127875:
        lVar9 = 0;
        do {
          bVar1 = pTVar6->aCol[uVar17].zCnName[lVar9];
          bVar2 = zColumn[lVar9];
          if (bVar1 == bVar2) {
            if ((ulong)bVar1 == 0) goto LAB_001278a7;
          }
          else if (""[bVar1] != ""[bVar2]) goto LAB_001278a7;
          lVar9 = lVar9 + 1;
        } while( true );
      }
      uVar16 = 0;
      goto LAB_001278c1;
    }
    if (local_1e0.zErrMsg != (char *)0x0) {
      local_1e8 = local_1e0.zErrMsg;
      local_1e0.zErrMsg = (char *)0x0;
    }
    uVar3 = db->noSharedCache;
    goto joined_r0x00127c1b;
  }
  local_230 = 0;
  goto LAB_00127bbb;
LAB_001278a7:
  if (bVar1 == bVar2) goto LAB_001278b7;
  uVar17 = uVar17 + 1;
  if (uVar17 == uVar14) goto code_r0x001278b4;
  goto LAB_00127875;
code_r0x001278b4:
  uVar17 = (ulong)uVar14;
LAB_001278b7:
  uVar16 = (uint)uVar17;
LAB_001278c1:
  if (uVar16 == uVar14) {
    local_1e8 = sqlite3MPrintf(db,"no such column: \"%s\"",zColumn);
    uVar3 = db->noSharedCache;
joined_r0x00127c1b:
    local_230 = 1;
    if (uVar3 == '\0') {
      btreeLeaveAll(db);
      local_230 = 1;
    }
LAB_00127bbb:
    if ((local_230 == 0) && (db->mallocFailed == '\0')) {
      *ppBlob = (sqlite3_blob *)p_00;
    }
    else if (p_00 != (Incrblob *)0x0) {
      if ((Vdbe *)p_00->pStmt != (Vdbe *)0x0) {
        sqlite3VdbeFinalize((Vdbe *)p_00->pStmt);
      }
      if (p_00 != (Incrblob *)0x0) {
        sqlite3DbFreeNN(db,p_00);
      }
    }
    p = local_1e8;
    pcVar15 = "%s";
    if (local_1e8 == (char *)0x0) {
      pcVar15 = (char *)0x0;
    }
    iVar12 = 0;
    sqlite3ErrorWithMsg(db,local_230,pcVar15,local_1e8);
    if (p != (char *)0x0) {
      sqlite3DbFreeNN(db,p);
    }
    sqlite3ParseObjectReset(&local_1e0);
    if ((local_230 != 0) || (db->mallocFailed != '\0')) {
      iVar12 = apiHandleError(db,local_230);
    }
    if (db->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return iVar12;
    }
    __stack_chk_fail();
  }
  if (wrFlag != 0) {
    if (((db->flags & 0x4000) == 0) || (pFVar13 = (pTVar6->u).tab.pFKey, pFVar13 == (FKey *)0x0)) {
      pcVar15 = (char *)0x0;
    }
    else {
      pcVar15 = (char *)0x0;
      do {
        if (0 < (long)pFVar13->nCol) {
          lVar9 = 0;
          do {
            if (*(uint *)((long)&pFVar13->aCol[0].iFrom + lVar9) == uVar16) {
              pcVar15 = "foreign key";
            }
            lVar9 = lVar9 + 0x10;
          } while ((long)pFVar13->nCol * 0x10 != lVar9);
        }
        pFVar13 = pFVar13->pNextFrom;
      } while (pFVar13 != (FKey *)0x0);
    }
    for (pIVar7 = pTVar6->pIndex; pIVar7 != (Index *)0x0; pIVar7 = pIVar7->pNext) {
      if ((ulong)pIVar7->nKeyCol != 0) {
        uVar17 = 0;
        do {
          if (uVar16 == (int)pIVar7->aiColumn[uVar17]) {
            pcVar15 = "indexed";
          }
          if ((int)pIVar7->aiColumn[uVar17] == 0xfffffffe) {
            pcVar15 = "indexed";
          }
          uVar17 = uVar17 + 1;
        } while (pIVar7->nKeyCol != uVar17);
      }
    }
    if (pcVar15 != (char *)0x0) {
      local_1e8 = sqlite3MPrintf(db,"cannot open %s column for writing",pcVar15);
      local_230 = 1;
      if (db->noSharedCache == '\0') {
        btreeLeaveAll(db);
      }
    }
    if (pcVar15 != (char *)0x0) goto LAB_00127bbb;
  }
  p_01 = sqlite3VdbeCreate(&local_1e0);
  p_00->pStmt = (sqlite3_stmt *)p_01;
  if (p_01 != (Vdbe *)0x0) {
    pSVar4 = pTVar6->pSchema;
    if (pSVar4 == (Schema *)0x0) {
      iVar12 = -0x8000;
    }
    else {
      iVar12 = -1;
      ppSVar10 = &db->aDb->pSchema;
      do {
        iVar12 = iVar12 + 1;
        pSVar5 = *ppSVar10;
        ppSVar10 = ppSVar10 + 4;
      } while (pSVar5 != pSVar4);
    }
    pOVar11 = (Op *)(ulong)p2;
    sqlite3VdbeAddOp4Int(p_01,2,iVar12,p2,pSVar4->schema_cookie,pSVar4->iGeneration);
    if (0 < (long)p_01->nOp) {
      pOVar11 = p_01->aOp;
      pOVar11[(long)p_01->nOp + -1].p5 = 1;
    }
    pVVar8 = sqlite3VdbeAddOpList(p_01,6,sqlite3_blob_open::openBlob,(int)pOVar11);
    uVar14 = 1 << ((byte)iVar12 & 0x1f);
    p_01->btreeMask = p_01->btreeMask | uVar14;
    if ((iVar12 != 1) && ((p_01->db->aDb[iVar12].pBt)->sharable != '\0')) {
      p_01->lockMask = p_01->lockMask | uVar14;
    }
    if (db->mallocFailed == '\0') {
      pVVar8->p1 = iVar12;
      pVVar8->p2 = pTVar6->tnum;
      pVVar8->p3 = p2;
      sqlite3VdbeChangeP4(p_01,2,pTVar6->zName,0);
    }
    if (db->mallocFailed == '\0') {
      if (wrFlag != 0) {
        pVVar8[1].opcode = 'q';
      }
      pVVar8[1].p2 = pTVar6->tnum;
      pVVar8[1].p3 = iVar12;
      pVVar8[1].p4type = -3;
      pVVar8[1].p4.i = pTVar6->nCol + 1;
      pVVar8[3].p2 = (int)pTVar6->nCol;
      local_1e0.nVar = 0;
      local_1e0.nTab = 1;
      local_1e0.nMem = 1;
      sqlite3VdbeMakeReady(p_01,&local_1e0);
    }
  }
  p_00->iCol = (u16)uVar16;
  p_00->db = db;
  if (db->noSharedCache == '\0') {
    btreeLeaveAll(db);
  }
  if (((db->mallocFailed != '\0') ||
      (local_230 = blobSeekToRow(p_00,iRow,&local_1e8), 0x30 < local_214)) || (local_230 != 0x11))
  goto LAB_00127bbb;
  local_214 = local_214 + 1;
  sqlite3ParseObjectReset(&local_1e0);
  local_230 = 0x11;
  goto LAB_00127695;
}

Assistant:

SQLITE_API int sqlite3_blob_open(
  sqlite3* db,            /* The database connection */
  const char *zDb,        /* The attached database containing the blob */
  const char *zTable,     /* The table containing the blob */
  const char *zColumn,    /* The column containing the blob */
  sqlite_int64 iRow,      /* The row containing the glob */
  int wrFlag,             /* True -> read/write access, false -> read-only */
  sqlite3_blob **ppBlob   /* Handle for accessing the blob returned here */
){
  int nAttempt = 0;
  int iCol;               /* Index of zColumn in row-record */
  int rc = SQLITE_OK;
  char *zErr = 0;
  Table *pTab;
  Incrblob *pBlob = 0;
  Parse sParse;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( ppBlob==0 ){
    return SQLITE_MISUSE_BKPT;
  }
#endif
  *ppBlob = 0;
#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) || zTable==0 || zColumn==0 ){
    return SQLITE_MISUSE_BKPT;
  }
#endif
  wrFlag = !!wrFlag;                /* wrFlag = (wrFlag ? 1 : 0); */

  sqlite3_mutex_enter(db->mutex);

  pBlob = (Incrblob *)sqlite3DbMallocZero(db, sizeof(Incrblob));
  while(1){
    sqlite3ParseObjectInit(&sParse,db);
    if( !pBlob ) goto blob_open_out;
    sqlite3DbFree(db, zErr);
    zErr = 0;

    sqlite3BtreeEnterAll(db);
    pTab = sqlite3LocateTable(&sParse, 0, zTable, zDb);
    if( pTab && IsVirtual(pTab) ){
      pTab = 0;
      sqlite3ErrorMsg(&sParse, "cannot open virtual table: %s", zTable);
    }
    if( pTab && !HasRowid(pTab) ){
      pTab = 0;
      sqlite3ErrorMsg(&sParse, "cannot open table without rowid: %s", zTable);
    }
    if( pTab && (pTab->tabFlags&TF_HasGenerated)!=0 ){
      pTab = 0;
      sqlite3ErrorMsg(&sParse, "cannot open table with generated columns: %s",
                      zTable);
    }
#ifndef SQLITE_OMIT_VIEW
    if( pTab && IsView(pTab) ){
      pTab = 0;
      sqlite3ErrorMsg(&sParse, "cannot open view: %s", zTable);
    }
#endif
    if( !pTab ){
      if( sParse.zErrMsg ){
        sqlite3DbFree(db, zErr);
        zErr = sParse.zErrMsg;
        sParse.zErrMsg = 0;
      }
      rc = SQLITE_ERROR;
      sqlite3BtreeLeaveAll(db);
      goto blob_open_out;
    }
    pBlob->pTab = pTab;
    pBlob->zDb = db->aDb[sqlite3SchemaToIndex(db, pTab->pSchema)].zDbSName;

    /* Now search pTab for the exact column. */
    for(iCol=0; iCol<pTab->nCol; iCol++) {
      if( sqlite3StrICmp(pTab->aCol[iCol].zCnName, zColumn)==0 ){
        break;
      }
    }
    if( iCol==pTab->nCol ){
      sqlite3DbFree(db, zErr);
      zErr = sqlite3MPrintf(db, "no such column: \"%s\"", zColumn);
      rc = SQLITE_ERROR;
      sqlite3BtreeLeaveAll(db);
      goto blob_open_out;
    }

    /* If the value is being opened for writing, check that the
    ** column is not indexed, and that it is not part of a foreign key.
    */
    if( wrFlag ){
      const char *zFault = 0;
      Index *pIdx;
#ifndef SQLITE_OMIT_FOREIGN_KEY
      if( db->flags&SQLITE_ForeignKeys ){
        /* Check that the column is not part of an FK child key definition. It
        ** is not necessary to check if it is part of a parent key, as parent
        ** key columns must be indexed. The check below will pick up this
        ** case.  */
        FKey *pFKey;
        assert( IsOrdinaryTable(pTab) );
        for(pFKey=pTab->u.tab.pFKey; pFKey; pFKey=pFKey->pNextFrom){
          int j;
          for(j=0; j<pFKey->nCol; j++){
            if( pFKey->aCol[j].iFrom==iCol ){
              zFault = "foreign key";
            }
          }
        }
      }
#endif
      for(pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext){
        int j;
        for(j=0; j<pIdx->nKeyCol; j++){
          /* FIXME: Be smarter about indexes that use expressions */
          if( pIdx->aiColumn[j]==iCol || pIdx->aiColumn[j]==XN_EXPR ){
            zFault = "indexed";
          }
        }
      }
      if( zFault ){
        sqlite3DbFree(db, zErr);
        zErr = sqlite3MPrintf(db, "cannot open %s column for writing", zFault);
        rc = SQLITE_ERROR;
        sqlite3BtreeLeaveAll(db);
        goto blob_open_out;
      }
    }

    pBlob->pStmt = (sqlite3_stmt *)sqlite3VdbeCreate(&sParse);
    assert( pBlob->pStmt || db->mallocFailed );
    if( pBlob->pStmt ){

      /* This VDBE program seeks a btree cursor to the identified
      ** db/table/row entry. The reason for using a vdbe program instead
      ** of writing code to use the b-tree layer directly is that the
      ** vdbe program will take advantage of the various transaction,
      ** locking and error handling infrastructure built into the vdbe.
      **
      ** After seeking the cursor, the vdbe executes an OP_ResultRow.
      ** Code external to the Vdbe then "borrows" the b-tree cursor and
      ** uses it to implement the blob_read(), blob_write() and
      ** blob_bytes() functions.
      **
      ** The sqlite3_blob_close() function finalizes the vdbe program,
      ** which closes the b-tree cursor and (possibly) commits the
      ** transaction.
      */
      static const int iLn = VDBE_OFFSET_LINENO(2);
      static const VdbeOpList openBlob[] = {
        {OP_TableLock,      0, 0, 0},  /* 0: Acquire a read or write lock */
        {OP_OpenRead,       0, 0, 0},  /* 1: Open a cursor */
        /* blobSeekToRow() will initialize r[1] to the desired rowid */
        {OP_NotExists,      0, 5, 1},  /* 2: Seek the cursor to rowid=r[1] */
        {OP_Column,         0, 0, 1},  /* 3  */
        {OP_ResultRow,      1, 0, 0},  /* 4  */
        {OP_Halt,           0, 0, 0},  /* 5  */
      };
      Vdbe *v = (Vdbe *)pBlob->pStmt;
      int iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
      VdbeOp *aOp;

      sqlite3VdbeAddOp4Int(v, OP_Transaction, iDb, wrFlag,
                           pTab->pSchema->schema_cookie,
                           pTab->pSchema->iGeneration);
      sqlite3VdbeChangeP5(v, 1);
      assert( sqlite3VdbeCurrentAddr(v)==2 || db->mallocFailed );
      aOp = sqlite3VdbeAddOpList(v, ArraySize(openBlob), openBlob, iLn);

      /* Make sure a mutex is held on the table to be accessed */
      sqlite3VdbeUsesBtree(v, iDb);

      if( db->mallocFailed==0 ){
        assert( aOp!=0 );
        /* Configure the OP_TableLock instruction */
#ifdef SQLITE_OMIT_SHARED_CACHE
        aOp[0].opcode = OP_Noop;
#else
        aOp[0].p1 = iDb;
        aOp[0].p2 = pTab->tnum;
        aOp[0].p3 = wrFlag;
        sqlite3VdbeChangeP4(v, 2, pTab->zName, P4_TRANSIENT);
      }
      if( db->mallocFailed==0 ){
#endif

        /* Remove either the OP_OpenWrite or OpenRead. Set the P2
        ** parameter of the other to pTab->tnum.  */
        if( wrFlag ) aOp[1].opcode = OP_OpenWrite;
        aOp[1].p2 = pTab->tnum;
        aOp[1].p3 = iDb;

        /* Configure the number of columns. Configure the cursor to
        ** think that the table has one more column than it really
        ** does. An OP_Column to retrieve this imaginary column will
        ** always return an SQL NULL. This is useful because it means
        ** we can invoke OP_Column to fill in the vdbe cursors type
        ** and offset cache without causing any IO.
        */
        aOp[1].p4type = P4_INT32;
        aOp[1].p4.i = pTab->nCol+1;
        aOp[3].p2 = pTab->nCol;

        sParse.nVar = 0;
        sParse.nMem = 1;
        sParse.nTab = 1;
        sqlite3VdbeMakeReady(v, &sParse);
      }
    }

    pBlob->iCol = iCol;
    pBlob->db = db;
    sqlite3BtreeLeaveAll(db);
    if( db->mallocFailed ){
      goto blob_open_out;
    }
    rc = blobSeekToRow(pBlob, iRow, &zErr);
    if( (++nAttempt)>=SQLITE_MAX_SCHEMA_RETRY || rc!=SQLITE_SCHEMA ) break;
    sqlite3ParseObjectReset(&sParse);
  }

blob_open_out:
  if( rc==SQLITE_OK && db->mallocFailed==0 ){
    *ppBlob = (sqlite3_blob *)pBlob;
  }else{
    if( pBlob && pBlob->pStmt ) sqlite3VdbeFinalize((Vdbe *)pBlob->pStmt);
    sqlite3DbFree(db, pBlob);
  }
  sqlite3ErrorWithMsg(db, rc, (zErr ? "%s" : (char*)0), zErr);
  sqlite3DbFree(db, zErr);
  sqlite3ParseObjectReset(&sParse);
  rc = sqlite3ApiExit(db, rc);
  sqlite3_mutex_leave(db->mutex);
  return rc;
}